

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

bool __thiscall dxil_spv::Converter::Impl::emit_global_heaps(Impl *this)

{
  AnnotateHandleReference *pAVar1;
  ResourceRemappingInterface *pRVar2;
  long lVar3;
  undefined8 uVar4;
  pointer ppAVar5;
  ComponentType CVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  Id IVar10;
  ulong uVar11;
  LoggingCallback p_Var12;
  void *pvVar13;
  byte bVar14;
  char cVar15;
  bool bVar16;
  undefined1 uVar17;
  ComponentType CVar18;
  VulkanSRVBinding *info;
  undefined1 uVar19;
  char *__ptr;
  ResourceKind RVar20;
  __normal_iterator<dxil_spv::Converter::Impl::AnnotateHandleReference_**,_std::vector<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>_>
  __i;
  __node_base *p_Var21;
  long lVar22;
  pointer ppAVar23;
  pointer ppAVar24;
  uint uVar25;
  size_t sStack_1120;
  AliasedAccess aliased_access;
  undefined1 local_10e8 [24];
  bool bStack_10d0;
  bool bStack_10cf;
  bool bStack_10ce;
  undefined1 uStack_10cd;
  uint32_t uStack_10cc;
  uint uStack_10c8;
  pointer local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  pointer local_10a0;
  ShaderStage local_1094;
  undefined4 uStack_1090;
  undefined8 uStack_108c;
  undefined8 uStack_1084;
  uint uStack_107c;
  Vector<AnnotateHandleReference_*> annotations;
  ShaderStage local_1058;
  undefined4 uStack_1054;
  undefined4 uStack_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  uint uStack_1040;
  uint local_103c;
  VulkanSRVBinding vulkan_srv_binding;
  VulkanBinding local_1008 [169];
  
  annotations.
  super__Vector_base<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  annotations.
  super__Vector_base<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  annotations.
  super__Vector_base<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var21 = &(this->llvm_annotate_handle_uses)._M_h._M_before_begin;
  while (ppAVar5 = annotations.
                   super__Vector_base<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
        ppAVar24 = annotations.
                   super__Vector_base<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
                   ._M_impl.super__Vector_impl_data._M_start, p_Var21 = p_Var21->_M_nxt,
        p_Var21 != (__node_base *)0x0) {
    vulkan_srv_binding.buffer_binding._0_8_ = p_Var21 + 2;
    std::
    vector<dxil_spv::Converter::Impl::AnnotateHandleReference*,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference*>>
    ::emplace_back<dxil_spv::Converter::Impl::AnnotateHandleReference*>
              ((vector<dxil_spv::Converter::Impl::AnnotateHandleReference*,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference*>>
                *)&annotations,(AnnotateHandleReference **)&vulkan_srv_binding);
  }
  if (annotations.
      super__Vector_base<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      annotations.
      super__Vector_base<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar22 = (long)annotations.
                   super__Vector_base<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)annotations.
                   super__Vector_base<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = lVar22 >> 3;
    lVar3 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<dxil_spv::Converter::Impl::AnnotateHandleReference**,std::vector<dxil_spv::Converter::Impl::AnnotateHandleReference*,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::Converter::Impl::emit_global_heaps()::__0>>
              (annotations.
               super__Vector_base<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
               annotations.
               super__Vector_base<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar22 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::Converter::Impl::AnnotateHandleReference**,std::vector<dxil_spv::Converter::Impl::AnnotateHandleReference*,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::Converter::Impl::emit_global_heaps()::__0>>
                (ppAVar24);
    }
    else {
      ppAVar23 = ppAVar24 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::Converter::Impl::AnnotateHandleReference**,std::vector<dxil_spv::Converter::Impl::AnnotateHandleReference*,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::Converter::Impl::emit_global_heaps()::__0>>
                (ppAVar24);
      for (; ppAVar23 != ppAVar5; ppAVar23 = ppAVar23 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<dxil_spv::Converter::Impl::AnnotateHandleReference**,std::vector<dxil_spv::Converter::Impl::AnnotateHandleReference*,dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference*>>>,__gnu_cxx::__ops::_Val_comp_iter<dxil_spv::Converter::Impl::emit_global_heaps()::__0>>
                  (ppAVar23);
      }
    }
  }
  local_10a0 = annotations.
               super__Vector_base<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  ppAVar24 = annotations.
             super__Vector_base<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppAVar24 == local_10a0) {
switchD_001142f6_default:
      bVar7 = ppAVar24 == local_10a0;
      std::
      _Vector_base<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
      ::~_Vector_base(&annotations.
                       super__Vector_base<dxil_spv::Converter::Impl::AnnotateHandleReference_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::AnnotateHandleReference_*>_>
                     );
      return bVar7;
    }
    pAVar1 = *ppAVar24;
    local_10e8._16_8_ = 0;
    bStack_10d0 = false;
    bStack_10cf = false;
    uStack_10cd = 0;
    uStack_10cc = 0;
    local_10e8[8] = Invalid;
    local_10e8._9_3_ = 0;
    local_10e8._12_4_ = ImageFormatUnknown;
    uStack_10c8 = 0;
    RVar20 = pAVar1->resource_kind;
    local_10e8[0] = pAVar1->resource_type;
    CVar18 = U32;
    if (local_10e8[0] == CBV) {
LAB_00114184:
      local_10e8[1] = U32;
      CVar6 = CVar18;
    }
    else {
      if ((byte)(RVar20 - RawBuffer) < 2) {
        if (local_10e8[0] == UAV) {
          local_10e8[8] = Invalid;
          local_10e8._9_3_ = 0;
          local_10e8._12_4_ = ImageFormatR32ui;
          CVar18 = U32;
        }
        goto LAB_00114184;
      }
      bVar14 = pAVar1->component_type - SNormF16;
      uVar25 = (uint)(0xa0a09090808 >> (bVar14 * '\b' & 0x3f));
      if (5 < bVar14) {
        uVar25 = (uint)pAVar1->component_type;
      }
      CVar18 = (ComponentType)uVar25;
      local_10e8[1] = U64;
      CVar6 = U64;
      if ((pAVar1->tracking).has_atomic_64bit == false) {
        CVar6 = CVar18;
        if (CVar18 == F16) {
          local_10e8[1] = F32;
        }
        else {
          if ((uVar25 & 0xff) == 3) goto LAB_00114184;
          local_10e8[1] = CVar18;
          if ((uVar25 & 0xff) == 2) {
            local_10e8[1] = I32;
          }
        }
      }
    }
    local_10e8._2_6_ = 0;
    local_10e8[8] = RVar20;
    if ((CVar6 == local_10e8[1]) || (6 < (byte)(CVar6 - I16))) {
      bStack_10ce = false;
    }
    else {
      bStack_10ce = SUB81(0x1000000000101 >> ((CVar6 - I16) * '\b' & 0x3f),0);
    }
    if (local_10e8[0] == UAV) {
      cVar8 = pAVar1->coherent;
      if ((bool)cVar8 == true) {
        (this->execution_mode_meta).declares_globallycoherent_uav = true;
      }
      cVar15 = pAVar1->rov;
      if ((bool)cVar15 == true) {
        (this->execution_mode_meta).declares_rov = true;
      }
      if ((this->shader_analysis).require_uav_thread_group_coherence == true) {
        pAVar1->coherent = true;
        cVar8 = '\x01';
      }
      if ((byte)(RVar20 - RawBuffer) < 2) {
        (pAVar1->tracking).has_read = true;
        (pAVar1->tracking).has_written = true;
        uVar17 = 1;
        uVar19 = 1;
      }
      else {
        uVar19 = (pAVar1->tracking).has_read;
        uVar17 = (pAVar1->tracking).has_written;
      }
      if (cVar8 != '\0') {
        cVar15 = '\x01';
      }
      local_10e8._16_8_ = (ulong)CONCAT12(cVar15,CONCAT11(uVar17,uVar19)) << 0x20;
      bVar7 = get_uav_image_format
                        (this,RVar20,CVar6,&pAVar1->tracking,(ImageFormat *)(local_10e8 + 0xc));
      if (!bVar7) goto switchD_001142f6_default;
      RVar20 = local_10e8[8];
    }
    uVar25 = -pAVar1->stride & pAVar1->stride;
    if (RVar20 == RawBuffer) {
      uVar25 = 0x10;
    }
    local_1094 = get_remapping_stage(this->execution_model);
    uStack_1090 = CONCAT31(uStack_1090._1_3_,RVar20);
    uStack_108c = 0xffffffff00000000;
    uStack_1084 = 0xffffffffffffffff;
    local_10a8._0_1_ = false;
    local_10a8._1_3_ = 0;
    local_10a8._4_4_ = Identity;
    local_10b8 = (pointer)0x0;
    uStack_10b0._0_4_ = 0;
    uStack_10b0._4_4_ = 0;
    pRVar2 = this->resource_mapping_iface;
    uStack_107c = uVar25;
    if (pRVar2 == (ResourceRemappingInterface *)0x0) goto switchD_001142f6_default;
    switch(local_10e8._0_8_ & 0xff) {
    case 0:
      vulkan_srv_binding.offset_binding.root_constant_index = 0;
      vulkan_srv_binding.offset_binding.bindless.heap_root_offset._0_2_ = 0;
      vulkan_srv_binding.offset_binding.bindless.heap_root_offset._2_2_ = 0;
      vulkan_srv_binding.offset_binding.bindless.use_heap = false;
      vulkan_srv_binding.offset_binding.bindless._5_3_ = 0;
      vulkan_srv_binding.offset_binding.descriptor_type._0_2_ = Identity;
      vulkan_srv_binding.offset_binding.descriptor_type._2_2_ = Identity >> 0x10;
      vulkan_srv_binding.buffer_binding.bindless.use_heap = false;
      vulkan_srv_binding.buffer_binding.bindless._5_3_ = 0;
      vulkan_srv_binding.buffer_binding.descriptor_type = Identity;
      vulkan_srv_binding.offset_binding._0_6_ = 0;
      vulkan_srv_binding.offset_binding.binding._2_2_ = 0;
      vulkan_srv_binding.buffer_binding.descriptor_set = 0;
      vulkan_srv_binding.buffer_binding.binding = 0;
      vulkan_srv_binding.buffer_binding.root_constant_index = 0;
      vulkan_srv_binding.buffer_binding.bindless.heap_root_offset = 0;
      iVar9 = (*pRVar2->_vptr_ResourceRemappingInterface[2])(pRVar2,&local_1094,&vulkan_srv_binding)
      ;
      local_10b8 = (pointer)vulkan_srv_binding.buffer_binding._0_8_;
      uStack_10b0._0_4_ = vulkan_srv_binding.buffer_binding.root_constant_index;
      uStack_10b0._4_4_ = vulkan_srv_binding.buffer_binding.bindless.heap_root_offset;
      local_10a8._0_1_ = vulkan_srv_binding.buffer_binding.bindless.use_heap;
      local_10a8._1_3_ = vulkan_srv_binding.buffer_binding.bindless._5_3_;
      local_10a8._4_4_ = vulkan_srv_binding.buffer_binding.descriptor_type;
      cVar8 = get_ssbo_offset_buffer_id
                        (this,&pAVar1->offset_buffer_id,&vulkan_srv_binding.buffer_binding,
                         &vulkan_srv_binding.offset_binding,pAVar1->resource_kind,uVar25);
      if ((char)iVar9 == '\0') goto switchD_001142f6_default;
      break;
    case 1:
      local_1008[0].descriptor_set = 0;
      local_1008[0].binding = 0;
      local_1008[0].root_constant_index = 0;
      local_1008[0].bindless.heap_root_offset = 0;
      vulkan_srv_binding.offset_binding.root_constant_index = 0;
      vulkan_srv_binding.offset_binding.bindless.heap_root_offset._0_2_ = 0;
      vulkan_srv_binding.offset_binding.bindless.heap_root_offset._2_2_ = 0;
      vulkan_srv_binding.offset_binding.bindless.use_heap = false;
      vulkan_srv_binding.offset_binding.bindless._5_3_ = 0;
      vulkan_srv_binding.offset_binding.descriptor_type._0_2_ = Identity;
      vulkan_srv_binding.offset_binding.descriptor_type._2_2_ = Identity >> 0x10;
      local_1008[0].bindless.use_heap = false;
      local_1008[0].bindless._5_3_ = 0;
      local_1008[0].descriptor_type = Identity;
      vulkan_srv_binding.buffer_binding.bindless.use_heap = false;
      vulkan_srv_binding.buffer_binding.bindless._5_3_ = 0;
      vulkan_srv_binding.buffer_binding.descriptor_type = Identity;
      vulkan_srv_binding.offset_binding._0_6_ = 0;
      vulkan_srv_binding.offset_binding.binding._2_2_ = 0;
      vulkan_srv_binding.buffer_binding.descriptor_set = 0;
      vulkan_srv_binding.buffer_binding.binding = 0;
      vulkan_srv_binding.buffer_binding.root_constant_index = 0;
      vulkan_srv_binding.buffer_binding.bindless.heap_root_offset = 0;
      uStack_1054 = uStack_1090;
      uStack_1050 = 0;
      uStack_104c = 0xffffffff;
      uStack_1048 = 0xffffffff;
      uStack_1044 = 0xffffffff;
      local_103c = (uint)pAVar1->counter;
      local_1058 = local_1094;
      uStack_1040 = uVar25;
      iVar9 = (*pRVar2->_vptr_ResourceRemappingInterface[4])(pRVar2,&local_1058,&vulkan_srv_binding)
      ;
      local_10b8 = (pointer)vulkan_srv_binding.buffer_binding._0_8_;
      uStack_10b0._0_4_ = vulkan_srv_binding.buffer_binding.root_constant_index;
      uStack_10b0._4_4_ = vulkan_srv_binding.buffer_binding.bindless.heap_root_offset;
      local_10a8._0_1_ = vulkan_srv_binding.buffer_binding.bindless.use_heap;
      local_10a8._1_3_ = vulkan_srv_binding.buffer_binding.bindless._5_3_;
      local_10a8._4_4_ = vulkan_srv_binding.buffer_binding.descriptor_type;
      bVar7 = get_ssbo_offset_buffer_id
                        (this,&pAVar1->offset_buffer_id,&vulkan_srv_binding.buffer_binding,
                         local_1008,pAVar1->resource_kind,uVar25);
      if (bVar7) {
        if (pAVar1->counter == true) {
          aliased_access.raw_declarations.
          super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          aliased_access.raw_declarations.
          super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_ = 0;
          aliased_access.raw_declarations.
          super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
          aliased_access.raw_declarations.
          super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
          aliased_access.requires_alias_decoration = false;
          aliased_access.override_primary_component_types = false;
          aliased_access.primary_component_type = Invalid;
          aliased_access._27_1_ = 0;
          aliased_access.raw_declarations.
          super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          aliased_access.raw_declarations.
          super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_2_ = 0;
          aliased_access.raw_declarations.
          super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
          ._M_impl.super__Vector_impl_data._M_finish._3_1_ = 0;
          aliased_access.raw_declarations.
          super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
          ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
          (pAVar1->counter_reference).push_constant_member = 0xffffffff;
          (pAVar1->counter_reference).stride = 4;
          (pAVar1->counter_reference).bindless = true;
          (pAVar1->counter_reference).base_resource_is_array = true;
          aliased_access.raw_declarations.
          super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x501;
          unique0x10000b24 =
               CONCAT26(vulkan_srv_binding.offset_binding.binding._2_2_,
                        vulkan_srv_binding.offset_binding._0_6_);
          if (((this->options).physical_storage_buffer == true) &&
             (CONCAT22(vulkan_srv_binding.offset_binding.descriptor_type._2_2_,
                       (undefined2)vulkan_srv_binding.offset_binding.descriptor_type) != 2)) {
            aliased_access.raw_declarations.
            super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
            RVar20 = RawBuffer;
          }
          else {
            aliased_access.raw_declarations.
            super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
            ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0xb;
            aliased_access.raw_declarations.
            super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_ = 0x101;
            aliased_access.raw_declarations.
            super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
            ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0x21;
            RVar20 = TypedBuffer;
          }
          (pAVar1->counter_reference).resource_kind = RVar20;
          IVar10 = create_bindless_heap_variable(this,(BindlessInfo *)&aliased_access);
          (pAVar1->counter_reference).var_id = IVar10;
        }
        if ((char)iVar9 != '\0') goto LAB_0011457f;
      }
      goto switchD_001142f6_default;
    case 2:
      aliased_access.raw_declarations.
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      aliased_access.raw_declarations.
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_ = 0;
      aliased_access.raw_declarations.
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      aliased_access.raw_declarations.
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      aliased_access.requires_alias_decoration = false;
      aliased_access.override_primary_component_types = false;
      aliased_access.primary_component_type = Invalid;
      aliased_access._27_1_ = 0;
      aliased_access.raw_declarations.
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      aliased_access.raw_declarations.
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      aliased_access.raw_declarations.
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_2_ = 0;
      aliased_access.raw_declarations.
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
      ._M_impl.super__Vector_impl_data._M_finish._3_1_ = 0;
      aliased_access.raw_declarations.
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
      iVar9 = (*pRVar2->_vptr_ResourceRemappingInterface[5])(pRVar2,&local_1094,&aliased_access);
      cVar8 = (char)iVar9;
      if (aliased_access.requires_alias_decoration != true) {
        uStack_10b0._1_2_ =
             aliased_access.raw_declarations.
             super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
             ._M_impl.super__Vector_impl_data._M_finish._1_2_;
        uStack_10b0._0_1_ =
             aliased_access.raw_declarations.
             super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
             ._M_impl.super__Vector_impl_data._M_finish._0_1_;
        uStack_10b0._3_1_ =
             aliased_access.raw_declarations.
             super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
             ._M_impl.super__Vector_impl_data._M_finish._3_1_;
        uStack_10b0._4_4_ =
             aliased_access.raw_declarations.
             super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
             ._M_impl.super__Vector_impl_data._M_finish._4_4_;
        local_10b8 = aliased_access.raw_declarations.
                     super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        local_10a8._4_4_ = UBO;
        local_10a8._0_4_ =
             aliased_access.raw_declarations.
             super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
        break;
      }
      p_Var12 = get_thread_log_callback();
      if (p_Var12 == (LoggingCallback)0x0) {
        __ptr = "[ERROR]: Cannot use push constants for SM 6.6 bindless.\n";
        sStack_1120 = 0x38;
        goto LAB_0011479e;
      }
      vulkan_srv_binding.offset_binding.root_constant_index = 0x362e3620;
      vulkan_srv_binding.offset_binding.bindless.heap_root_offset._0_2_ = 0x6220;
      vulkan_srv_binding.offset_binding.bindless.heap_root_offset._2_2_ = 0x6e69;
      vulkan_srv_binding.offset_binding.bindless.use_heap = true;
      vulkan_srv_binding.offset_binding.bindless._5_3_ = 0x73656c;
      vulkan_srv_binding.offset_binding.descriptor_type._0_2_ = 0x2e73;
      vulkan_srv_binding.offset_binding.descriptor_type._2_2_ = 10;
      vulkan_srv_binding.buffer_binding._16_8_ = 0x746e6174736e6f63;
      vulkan_srv_binding.offset_binding._0_6_ = 0x20726f662073;
      vulkan_srv_binding.offset_binding.binding._2_2_ = 0x4d53;
      vulkan_srv_binding.buffer_binding.descriptor_set._0_1_ = 'C';
      vulkan_srv_binding.buffer_binding.descriptor_set._1_1_ = 'a';
      vulkan_srv_binding.buffer_binding.descriptor_set._2_1_ = 'n';
      vulkan_srv_binding.buffer_binding.descriptor_set._3_1_ = 'n';
      vulkan_srv_binding.buffer_binding.binding._0_1_ = 'o';
      vulkan_srv_binding.buffer_binding.binding._1_1_ = 't';
      vulkan_srv_binding.buffer_binding.binding._2_1_ = ' ';
      vulkan_srv_binding.buffer_binding.binding._3_1_ = 'u';
      vulkan_srv_binding.buffer_binding.root_constant_index._0_1_ = 's';
      vulkan_srv_binding.buffer_binding.root_constant_index._1_1_ = 'e';
      vulkan_srv_binding.buffer_binding.root_constant_index._2_1_ = ' ';
      vulkan_srv_binding.buffer_binding.root_constant_index._3_1_ = 'p';
      vulkan_srv_binding.buffer_binding.bindless.heap_root_offset._0_1_ = 'u';
      vulkan_srv_binding.buffer_binding.bindless.heap_root_offset._1_1_ = 's';
      vulkan_srv_binding.buffer_binding.bindless.heap_root_offset._2_1_ = 'h';
      vulkan_srv_binding.buffer_binding.bindless.heap_root_offset._3_1_ = ' ';
      goto LAB_00114739;
    case 3:
      iVar9 = (*pRVar2->_vptr_ResourceRemappingInterface[3])(pRVar2,&local_1094,&local_10b8);
      cVar8 = (char)iVar9;
      break;
    default:
      goto switchD_001142f6_default;
    }
    if (cVar8 == '\0') goto switchD_001142f6_default;
LAB_0011457f:
    if (local_10a8._0_1_ == false) {
      p_Var12 = get_thread_log_callback();
      if (p_Var12 == (LoggingCallback)0x0) {
        __ptr = "[ERROR]: SM 6.6 bindless references must be bindless.\n";
        sStack_1120 = 0x36;
LAB_0011479e:
        fwrite(__ptr,sStack_1120,1,_stderr);
        fflush(_stderr);
      }
      else {
        vulkan_srv_binding.offset_binding.root_constant_index = 0x62206562;
        vulkan_srv_binding.offset_binding.bindless.heap_root_offset._0_2_ = 0x6e69;
        vulkan_srv_binding.offset_binding.bindless.heap_root_offset._2_2_ = 0x6c64;
        vulkan_srv_binding.offset_binding.bindless.use_heap = true;
        vulkan_srv_binding.offset_binding.bindless._5_3_ = 0x2e7373;
        vulkan_srv_binding.offset_binding.descriptor_type._0_2_ = 10;
        vulkan_srv_binding.buffer_binding._16_8_ = 0x636e657265666572;
        vulkan_srv_binding.offset_binding._0_6_ = 0x73756d207365;
        vulkan_srv_binding.offset_binding.binding._2_2_ = 0x2074;
        vulkan_srv_binding.buffer_binding.descriptor_set._0_1_ = 'S';
        vulkan_srv_binding.buffer_binding.descriptor_set._1_1_ = 'M';
        vulkan_srv_binding.buffer_binding.descriptor_set._2_1_ = ' ';
        vulkan_srv_binding.buffer_binding.descriptor_set._3_1_ = '6';
        vulkan_srv_binding.buffer_binding.binding._0_1_ = '.';
        vulkan_srv_binding.buffer_binding.binding._1_1_ = '6';
        vulkan_srv_binding.buffer_binding.binding._2_1_ = ' ';
        vulkan_srv_binding.buffer_binding.binding._3_1_ = 'b';
        vulkan_srv_binding.buffer_binding.root_constant_index._0_1_ = 'i';
        vulkan_srv_binding.buffer_binding.root_constant_index._1_1_ = 'n';
        vulkan_srv_binding.buffer_binding.root_constant_index._2_1_ = 'd';
        vulkan_srv_binding.buffer_binding.root_constant_index._3_1_ = 'l';
        vulkan_srv_binding.buffer_binding.bindless.heap_root_offset._0_1_ = 'e';
        vulkan_srv_binding.buffer_binding.bindless.heap_root_offset._1_1_ = 's';
        vulkan_srv_binding.buffer_binding.bindless.heap_root_offset._2_1_ = 's';
        vulkan_srv_binding.buffer_binding.bindless.heap_root_offset._3_1_ = ' ';
LAB_00114739:
        pvVar13 = get_thread_log_callback_userdata();
        (*p_Var12)(pvVar13,Error,(char *)&vulkan_srv_binding);
      }
      goto switchD_001142f6_default;
    }
    stack0xffffffffffffef04 = stack0xffffffffffffef04 & 0xffffffff00000000;
    aliased_access.raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    aliased_access.raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    aliased_access.raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_2_ = 0;
    aliased_access.raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
    ._M_impl.super__Vector_impl_data._M_finish._3_1_ = 0;
    aliased_access.raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    aliased_access.raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    aliased_access.raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_ = 0;
    aliased_access.raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    aliased_access.raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    aliased_access.requires_alias_decoration = false;
    aliased_access.override_primary_component_types = false;
    aliased_access.primary_component_type = Invalid;
    bVar7 = analyze_aliased_access(this,&pAVar1->tracking,local_10a8._4_4_,&aliased_access);
    if (!bVar7) {
      std::
      _Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
      ::~_Vector_base((_Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
                       *)&aliased_access);
      goto switchD_001142f6_default;
    }
    uStack_10cc = (uint32_t)local_10b8;
    uStack_10c8 = (uint)((ulong)local_10b8 >> 0x20);
    local_10e8._16_4_ = local_10a8._4_4_;
    uVar4 = local_10e8._16_8_;
    bStack_10cf = aliased_access.requires_alias_decoration;
    (pAVar1->reference).bindless = true;
    (pAVar1->reference).base_resource_is_array = true;
    (pAVar1->reference).push_constant_member = 0xffffffff;
    (pAVar1->reference).stride = pAVar1->stride;
    (pAVar1->reference).resource_kind = pAVar1->resource_kind;
    bVar7 = pAVar1->rov;
    bVar16 = bVar7;
    if (pAVar1->coherent != false) {
      bVar16 = true;
    }
    (pAVar1->reference).coherent = bVar16;
    (pAVar1->reference).rov = bVar7;
    if (aliased_access.requires_alias_decoration == true) {
      create_bindless_heap_variable_alias_group
                ((Vector<Converter::Impl::RawDeclarationVariable> *)&vulkan_srv_binding,this,
                 (BindlessInfo *)local_10e8,&aliased_access.raw_declarations);
      std::
      vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ::_M_move_assign(&(pAVar1->reference).var_alias_group);
      std::
      _Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ::~_Vector_base((_Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                       *)&vulkan_srv_binding);
    }
    else {
      if (aliased_access.override_primary_component_types == true) {
        vulkan_srv_binding.buffer_binding.root_constant_index = local_10e8._8_4_;
        vulkan_srv_binding.buffer_binding.bindless.heap_root_offset = local_10e8._12_4_;
        vulkan_srv_binding.offset_binding.root_constant_index = uStack_10c8;
        local_10e8[0x10] = (undefined1)local_10a8._4_4_;
        local_10e8._17_3_ = (undefined3)(local_10a8._4_4_ >> 8);
        vulkan_srv_binding.buffer_binding.bindless.use_heap = (bool)local_10e8[0x10];
        vulkan_srv_binding.buffer_binding.bindless._5_3_ = local_10e8._17_3_;
        vulkan_srv_binding.buffer_binding.descriptor_type = local_10e8._20_4_;
        vulkan_srv_binding.offset_binding._0_6_ =
             SUB86(CONCAT44(uStack_10cc,
                            CONCAT13(uStack_10cd,
                                     CONCAT12(bStack_10ce,
                                              CONCAT11(aliased_access.requires_alias_decoration,
                                                       bStack_10d0)))),0);
        vulkan_srv_binding.offset_binding.binding._2_2_ = (undefined2)((ulong)local_10b8 >> 0x10);
        vulkan_srv_binding.buffer_binding._2_6_ = SUB86(local_10e8._0_8_,2);
        vulkan_srv_binding.buffer_binding.descriptor_set._0_1_ = (undefined1)local_10e8._0_8_;
        vulkan_srv_binding.buffer_binding.descriptor_set._1_1_ =
             aliased_access.primary_component_type;
        vulkan_srv_binding.buffer_binding.binding = aliased_access.primary_raw_vecsize;
        info = &vulkan_srv_binding;
      }
      else {
        info = (VulkanSRVBinding *)local_10e8;
      }
      local_10e8._16_8_ = uVar4;
      IVar10 = create_bindless_heap_variable(this,(BindlessInfo *)info);
      (pAVar1->reference).var_id = IVar10;
    }
    (pAVar1->reference).aliased = aliased_access.requires_alias_decoration;
    std::
    _Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
    ::~_Vector_base((_Vector_base<dxil_spv::Converter::Impl::RawDeclaration,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclaration>_>
                     *)&aliased_access);
    ppAVar24 = ppAVar24 + 1;
  } while( true );
}

Assistant:

bool Converter::Impl::emit_global_heaps()
{
	Vector<AnnotateHandleReference *> annotations;
	for (auto &use : llvm_annotate_handle_uses)
		annotations.push_back(&use.second);

	// Ensure reproducible codegen since we iterate over an unordered map.
	std::sort(annotations.begin(), annotations.end(),
	          [](const AnnotateHandleReference *a, const AnnotateHandleReference *b) {
	              return a->ordinal < b->ordinal;
	          });

	for (auto *annotation : annotations)
	{
		BindlessInfo info = {};

		auto actual_component_type = DXIL::ComponentType::U32;
		info.format = spv::ImageFormatUnknown;
		if (annotation->resource_type != DXIL::ResourceType::CBV &&
		    annotation->resource_kind != DXIL::ResourceKind::RawBuffer &&
		    annotation->resource_kind != DXIL::ResourceKind::StructuredBuffer)
		{
			actual_component_type = normalize_component_type(annotation->component_type);
			if (annotation->tracking.has_atomic_64bit)
			{
				// The component type in DXIL is u32, even if the resource itself is u64 in meta reflection data ...
				// This is also the case for signed components. Always use R64UI here.
				actual_component_type = DXIL::ComponentType::U64;
			}
		}
		else if (annotation->resource_type == DXIL::ResourceType::UAV)
		{
			info.format = spv::ImageFormatR32ui;
		}

		auto effective_component_type = get_effective_typed_resource_type(actual_component_type);

		info.type = annotation->resource_type;
		info.component = effective_component_type;
		info.kind = annotation->resource_kind;
		info.relaxed_precision = actual_component_type != effective_component_type &&
		                         component_type_is_16bit(actual_component_type);

		if (info.type == DXIL::ResourceType::UAV)
		{
			// See emit_uavs() for details around coherent and memory model shenanigans ...
			if (annotation->coherent)
				execution_mode_meta.declares_globallycoherent_uav = true;
			if (annotation->rov)
				execution_mode_meta.declares_rov = true;

			// Do not attempt to track read and write here to figure out if this resource in particular needs to be coherent.
			// It's plausible that the write and read can happen across
			// two different accesses to ResourceDescriptorHeap[]. Don't take any chances here ...
			if (shader_analysis.require_uav_thread_group_coherence)
				annotation->coherent = true;

			if (annotation->resource_kind == DXIL::ResourceKind::StructuredBuffer ||
			    annotation->resource_kind == DXIL::ResourceKind::RawBuffer)
			{
				// In case there is aliasing through different declarations,
				// we cannot emit NonWritable or NonReadable safely. Assume full read-write.
				// Be a bit careful with typed resources since it's not always supported with read-write + typed.
				annotation->tracking.has_read = true;
				annotation->tracking.has_written = true;
			}

			info.uav_coherent = annotation->coherent || annotation->rov;
			info.uav_read = annotation->tracking.has_read;
			info.uav_written = annotation->tracking.has_written;
			if (!get_uav_image_format(annotation->resource_kind, actual_component_type,
			                          annotation->tracking, info.format))
			{
				return false;
			}
		}

		unsigned stride = annotation->stride;
		unsigned alignment = info.kind == DXIL::ResourceKind::RawBuffer ? 16 : (stride & -int(stride));
		D3DBinding d3d_binding = {
			get_remapping_stage(execution_model), info.kind, 0,
			UINT32_MAX, UINT32_MAX, UINT32_MAX, alignment,
		};
		VulkanBinding vulkan_binding = {};

		bool remap_success = false;
		if (resource_mapping_iface)
		{
			switch (info.type)
			{
			case DXIL::ResourceType::SRV:
			{
				VulkanSRVBinding vulkan_srv_binding = {};
				remap_success = resource_mapping_iface->remap_srv(d3d_binding, vulkan_srv_binding);
				vulkan_binding = vulkan_srv_binding.buffer_binding;
				if (!get_ssbo_offset_buffer_id(annotation->offset_buffer_id, vulkan_srv_binding.buffer_binding,
				                               vulkan_srv_binding.offset_binding, annotation->resource_kind, alignment))
				{
					return false;
				}
				break;
			}

			case DXIL::ResourceType::UAV:
			{
				VulkanUAVBinding vulkan_uav_binding = {};
				D3DUAVBinding d3d_uav_binding = {};

				d3d_uav_binding.binding = d3d_binding;
				d3d_uav_binding.counter = annotation->counter;

				remap_success = resource_mapping_iface->remap_uav(d3d_uav_binding, vulkan_uav_binding);
				vulkan_binding = vulkan_uav_binding.buffer_binding;
				if (!get_ssbo_offset_buffer_id(annotation->offset_buffer_id, vulkan_uav_binding.buffer_binding,
											   vulkan_uav_binding.offset_binding, annotation->resource_kind, alignment))
				{
					return false;
				}

				if (annotation->counter)
				{
					auto &counter_binding = vulkan_uav_binding.counter_binding;
					BindlessInfo counter_info = {};

					annotation->counter_reference.base_resource_is_array = true;
					annotation->counter_reference.push_constant_member = UINT32_MAX;
					annotation->counter_reference.stride = 4;
					annotation->counter_reference.bindless = true;

					counter_info.type = DXIL::ResourceType::UAV;
					counter_info.component = DXIL::ComponentType::U32;
					counter_info.desc_set = counter_binding.descriptor_set;
					counter_info.binding = counter_binding.binding;

					if (options.physical_storage_buffer &&
					    counter_binding.descriptor_type != VulkanDescriptorType::TexelBuffer)
					{
						counter_info.kind = DXIL::ResourceKind::Invalid;
						counter_info.counters = true;
						annotation->counter_reference.resource_kind = DXIL::ResourceKind::RawBuffer;
					}
					else
					{
						counter_info.kind = DXIL::ResourceKind::RawBuffer;
						counter_info.uav_read = true;
						counter_info.uav_written = true;
						counter_info.uav_coherent = false;
						counter_info.format = spv::ImageFormatR32ui;
						annotation->counter_reference.resource_kind = DXIL::ResourceKind::TypedBuffer;
					}

					annotation->counter_reference.var_id = create_bindless_heap_variable(counter_info);
				}
				break;
			}

			case DXIL::ResourceType::CBV:
			{
				VulkanCBVBinding vulkan_cbv_binding = {};
				remap_success = resource_mapping_iface->remap_cbv(d3d_binding, vulkan_cbv_binding);
				if (vulkan_cbv_binding.push_constant)
				{
					LOGE("Cannot use push constants for SM 6.6 bindless.\n");
					return false;
				}
				vulkan_binding = vulkan_cbv_binding.buffer;
				vulkan_binding.descriptor_type = VulkanDescriptorType::UBO;
				break;
			}

			case DXIL::ResourceType::Sampler:
				remap_success = resource_mapping_iface->remap_sampler(d3d_binding, vulkan_binding);
				break;
			}
		}

		if (!remap_success)
			return false;

		if (!vulkan_binding.bindless.use_heap)
		{
			LOGE("SM 6.6 bindless references must be bindless.\n");
			return false;
		}

		AliasedAccess aliased_access;
		if (!analyze_aliased_access(annotation->tracking, vulkan_binding.descriptor_type, aliased_access))
			return false;

		info.desc_set = vulkan_binding.descriptor_set;
		info.binding = vulkan_binding.binding;
		info.descriptor_type = vulkan_binding.descriptor_type;
		info.aliased = aliased_access.requires_alias_decoration;

		annotation->reference.bindless = true;
		annotation->reference.base_resource_is_array = true;
		annotation->reference.push_constant_member = UINT32_MAX;
		annotation->reference.stride = annotation->stride;
		annotation->reference.resource_kind = annotation->resource_kind;
		annotation->reference.coherent = annotation->coherent || annotation->rov;
		annotation->reference.rov = annotation->rov;

		if (aliased_access.requires_alias_decoration)
		{
			annotation->reference.var_alias_group = create_bindless_heap_variable_alias_group(
			    info, aliased_access.raw_declarations);
		}
		else if (aliased_access.override_primary_component_types)
		{
			auto tmp_info = info;
			tmp_info.component = aliased_access.primary_component_type;
			tmp_info.raw_vecsize = aliased_access.primary_raw_vecsize;
			annotation->reference.var_id = create_bindless_heap_variable(tmp_info);
		}
		else
			annotation->reference.var_id = create_bindless_heap_variable(info);

		annotation->reference.aliased = aliased_access.requires_alias_decoration;
	}

	return true;
}